

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processor.hpp
# Opt level: O3

void __thiscall Processor::Processor(Processor *this)

{
  _Rb_tree_header *p_Var1;
  ReservationStation **ppRVar2;
  long lVar3;
  mapped_type *pmVar4;
  size_t sVar5;
  key_type pRVar6;
  key_type pRVar7;
  key_type pRVar8;
  int i;
  ulong uVar9;
  char buffer [256];
  key_type local_178;
  key_type local_170 [2];
  ReservationStation local_160 [6];
  
  this->cycle = 0;
  this->jumping = false;
  local_160[0].fu = (FunctionalUnit *)&this->to_write_back;
  (this->to_write_back).super__Vector_base<ToWriteBack,_std::allocator<ToWriteBack>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->to_write_back).super__Vector_base<ToWriteBack,_std::allocator<ToWriteBack>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->to_write_back).super__Vector_base<ToWriteBack,_std::allocator<ToWriteBack>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar3 = 0;
  do {
    *(undefined4 *)((long)&this->registers[0].value + lVar3) = 0;
    *(undefined8 *)((long)&this->registers[0].rs + lVar3) = 0;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x200);
  p_Var1 = &(this->rs_names)._M_t._M_impl.super__Rb_tree_header;
  (this->rs_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->rs_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->rs_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->rs_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  memset(&(this->rs_names)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0x29c);
  local_170[0] = (ReservationStation *)0x0;
  local_160[0].instruction = (Instruction *)&this->rs_names;
  local_160[0].qj = (ReservationStation *)this;
  pmVar4 = std::
           map<ReservationStation_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ReservationStation_*>,_std::allocator<std::pair<ReservationStation_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->rs_names,local_170);
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,0x10833e);
  pRVar7 = this->add_sub_rs;
  pRVar8 = this->mul_div_rs;
  pRVar6 = this->load_rs;
  ppRVar2 = &local_160[0].qk;
  uVar9 = 0;
  do {
    sprintf((char *)ppRVar2,"ADD_SUB_RS[%d]",uVar9 & 0xffffffff);
    local_170[0] = local_160;
    sVar5 = strlen((char *)ppRVar2);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_170,ppRVar2,(long)&local_160[0].qk + sVar5);
    local_178 = pRVar7;
    pmVar4 = std::
             map<ReservationStation_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ReservationStation_*>,_std::allocator<std::pair<ReservationStation_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<ReservationStation_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ReservationStation_*>,_std::allocator<std::pair<ReservationStation_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_160[0].instruction,&local_178);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)local_170);
    if (local_170[0] != local_160) {
      operator_delete(local_170[0],local_160[0]._0_8_ + 1);
    }
    uVar9 = uVar9 + 1;
    pRVar7 = pRVar7 + 1;
  } while (uVar9 != 6);
  ppRVar2 = &local_160[0].qk;
  uVar9 = 0;
  do {
    sprintf((char *)ppRVar2,"MUL_DIV_RS[%d]",uVar9 & 0xffffffff);
    local_170[0] = local_160;
    sVar5 = strlen((char *)ppRVar2);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_170,ppRVar2,(long)&local_160[0].qk + sVar5);
    local_178 = pRVar8;
    pmVar4 = std::
             map<ReservationStation_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ReservationStation_*>,_std::allocator<std::pair<ReservationStation_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<ReservationStation_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ReservationStation_*>,_std::allocator<std::pair<ReservationStation_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_160[0].instruction,&local_178);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)local_170);
    if (local_170[0] != local_160) {
      operator_delete(local_170[0],local_160[0]._0_8_ + 1);
    }
    uVar9 = uVar9 + 1;
    pRVar8 = pRVar8 + 1;
  } while (uVar9 != 3);
  ppRVar2 = &local_160[0].qk;
  uVar9 = 0;
  do {
    sprintf((char *)ppRVar2,"LOAD_RS[%d]",uVar9 & 0xffffffff);
    local_170[0] = local_160;
    sVar5 = strlen((char *)ppRVar2);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_170,ppRVar2,(long)&local_160[0].qk + sVar5);
    local_178 = pRVar6;
    pmVar4 = std::
             map<ReservationStation_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ReservationStation_*>,_std::allocator<std::pair<ReservationStation_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<ReservationStation_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<ReservationStation_*>,_std::allocator<std::pair<ReservationStation_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_160[0].instruction,&local_178);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)local_170);
    if (local_170[0] != local_160) {
      operator_delete(local_170[0],local_160[0]._0_8_ + 1);
    }
    uVar9 = uVar9 + 1;
    pRVar6 = pRVar6 + 1;
  } while (uVar9 != 3);
  return;
}

Assistant:

Processor() {
        char buffer[256];
        rs_names[nullptr] = "null";
        for (int i = 0; i < NUM_ADD_SUB_RS; ++ i)
            sprintf(buffer, "ADD_SUB_RS[%d]", i), rs_names[&add_sub_rs[i]] = std::string(buffer);
        for (int i = 0; i < NUM_MUL_DIV_RS; ++ i)
            sprintf(buffer, "MUL_DIV_RS[%d]", i), rs_names[&mul_div_rs[i]] = std::string(buffer);
        for (int i = 0; i < NUM_LOAD_RS; ++ i)
            sprintf(buffer, "LOAD_RS[%d]", i), rs_names[&load_rs[i]] = std::string(buffer);
    }